

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::
Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::StringLengthCompare>_>
::Impl<1UL,_false>::insert
          (Impl<1UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  StringPtr **ppSVar1;
  RemoveConst<kj::StringPtr> **ppRVar2;
  uint uVar3;
  StringPtr *pSVar4;
  size_t sVar5;
  HashBucket *pHVar6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar10;
  StringPtr *size;
  char **ppcVar11;
  uint uVar12;
  ArrayDisposer *pAVar13;
  undefined4 in_register_00000084;
  ulong uVar14;
  char **ppcVar15;
  Maybe<unsigned_long> MVar16;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  bool success;
  bool local_79;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *local_78;
  size_t local_70;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  local_68;
  
  if (skip != 1) {
    pSVar4 = (table->rows).builder.ptr;
    lVar9 = (long)(table->rows).builder.pos - (long)pSVar4 >> 4;
    sVar5 = (row->content).size_;
    pHVar6 = (HashBucket *)table[1].rows.builder.disposer;
    size = (StringPtr *)(((long)&((table[1].rows.builder.pos)->content).ptr + lVar9) * 3 + 3);
    local_70 = pos;
    if ((StringPtr *)((long)pHVar6 * 2) < size) {
      ppSVar1 = &table[1].rows.builder.endPtr;
      oldBuckets.size_ = lVar9 * 3 + 3;
      oldBuckets.ptr = pHVar6;
      local_78 = (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *
                 )row;
      _::rehash((Array<kj::_::HashBucket> *)&local_68,(_ *)*ppSVar1,oldBuckets,
                CONCAT44(in_register_00000084,skip));
      size = *ppSVar1;
      if (size != (StringPtr *)0x0) {
        pAVar13 = table[1].rows.builder.disposer;
        *ppSVar1 = (StringPtr *)0x0;
        table[1].rows.builder.disposer = (ArrayDisposer *)0x0;
        (**(code **)**(undefined8 **)&table[1].indexes)
                  (*(undefined8 **)&table[1].indexes,size,8,pAVar13,pAVar13,0);
      }
      table[1].rows.builder.endPtr =
           (StringPtr *)CONCAT71(local_68.maybeFunc.ptr._1_7_,local_68.maybeFunc.ptr.isSet);
      table[1].rows.builder.disposer = (ArrayDisposer *)local_68.maybeFunc.ptr.field_1.value.success
      ;
      *(HashIndex<kj::_::(anonymous_namespace)::StringHasher> **)&table[1].indexes =
           local_68.maybeFunc.ptr.field_1.value.indexObj;
      table[1].rows.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
      row = (StringPtr *)local_78;
    }
    local_78 = table + 1;
    uVar8 = _::anon_unknown_0::StringLengthCompare::hashCode
                      ((StringLengthCompare *)(sVar5 - 1),(size_t)size);
    aVar10 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
             table[1].rows.builder.disposer;
    uVar12 = (int)aVar10.value - 1U & uVar8;
    ppcVar11 = (char **)0x0;
LAB_001733c0:
    ppcVar15 = &((table[1].rows.builder.endPtr)->content).ptr + uVar12;
    uVar3 = *(uint *)((long)ppcVar15 + 4);
    uVar14 = (ulong)uVar3;
    if (uVar3 == 1) {
      if (ppcVar11 == (char **)0x0) {
        ppcVar11 = ppcVar15;
      }
    }
    else {
      if (uVar3 == 0) {
        if (ppcVar11 != (char **)0x0) {
          ppRVar2 = &table[1].rows.builder.pos;
          *ppRVar2 = (RemoveConst<kj::StringPtr> *)((long)&(*ppRVar2)[-1].content.size_ + 7);
          ppcVar15 = ppcVar11;
        }
        *ppcVar15 = (char *)(((ulong)uVar8 | pos << 0x20) + 0x200000000);
        bVar7 = false;
        goto LAB_0017342c;
      }
      if ((*(uint *)ppcVar15 == uVar8) &&
         (uVar14 = (ulong)(uVar3 - 2), pSVar4[uVar14].content.size_ == sVar5)) goto LAB_0017342a;
    }
    pAVar13 = (ArrayDisposer *)((ulong)uVar12 + 1);
    uVar12 = (uint)pAVar13;
    if (pAVar13 == (ArrayDisposer *)aVar10.value) {
      uVar12 = 0;
    }
    goto LAB_001733c0;
  }
  *this = (Impl<1UL,_false>)0x0;
  aVar10 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)pos;
LAB_00173472:
  MVar16.ptr.field_1.value = aVar10.value;
  MVar16.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar16.ptr;
LAB_0017342a:
  bVar7 = true;
LAB_0017342c:
  if (bVar7) {
    *this = (Impl<1UL,_false>)0x1;
    *(ulong *)(this + 8) = uVar14;
  }
  else {
    local_68.maybeFunc.ptr.field_1.value.success = &local_79;
    local_68.maybeFunc.ptr.isSet = true;
    local_68.maybeFunc.ptr.field_1.value.indexObj =
         (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)local_78;
    local_68.maybeFunc.ptr.field_1.value.pos = &local_70;
    *this = (Impl<1UL,_false>)0x0;
    local_79 = true;
    local_68.maybeFunc.ptr.field_1.value.table = table;
    local_68.maybeFunc.ptr.field_1.value.row = row;
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
    ::~Deferred(&local_68);
    aVar10 = extraout_RDX;
  }
  goto LAB_00173472;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }